

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.hpp
# Opt level: O0

diff_out<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_exchange_export_fragment_cpp:59:41)>
 __thiscall
pstore::diff_details::
traverser<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
::
visit_node<pstore::exchange::export_ns::diff_out<pstore::exchange::export_ns::emit_fragments(pstore::exchange::export_ns::ostream&,pstore::exchange::export_ns::indent,pstore::database_const&,unsigned_int,pstore::exchange::export_ns::string_mapping_const&,bool)::__0>>
          (traverser<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
           *this,index_pointer node,uint shifts,
          diff_out<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_exchange_export_fragment_cpp:59:41)>
          out)

{
  bool bVar1;
  address addr;
  diff_out<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_exchange_export_fragment_cpp:59:41)>
  *this_00;
  uint shifts_local;
  traverser<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  *this_local;
  diff_out<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_exchange_export_fragment_cpp:59:41)>
  out_local;
  index_pointer node_local;
  
  this_local = (traverser<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                *)out.fn_;
  out_local.fn_ = (anon_class_56_7_97667f36 *)node;
  bVar1 = pstore::index::details::index_pointer::is_leaf((index_pointer *)&out_local);
  if (bVar1) {
    bVar1 = pstore::index::details::index_pointer::is_address((index_pointer *)&out_local);
    if (!bVar1) {
      assert_failed("node.is_address ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/diff.hpp"
                    ,0x62);
    }
    bVar1 = traverser<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
            ::is_new((traverser<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                      *)this,(index_pointer)out_local.fn_);
    if (bVar1) {
      addr = pstore::index::details::index_pointer::to_address((index_pointer *)&out_local);
      this_00 = exchange::export_ns::
                diff_out<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/export_fragment.cpp:59:41)>
                ::operator*((diff_out<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_exchange_export_fragment_cpp:59:41)>
                             *)&this_local);
      exchange::export_ns::
      diff_out<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/export_fragment.cpp:59:41)>
      ::operator=(this_00,addr);
      exchange::export_ns::
      diff_out<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/export_fragment.cpp:59:41)>
      ::operator++((diff_out<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_exchange_export_fragment_cpp:59:41)>
                    *)&this_local);
    }
    node_local.internal_ = (internal_node *)this_local;
  }
  else {
    bVar1 = pstore::index::details::depth_is_internal_node(shifts);
    if (bVar1) {
      node_local.addr_.a_ =
           (address)visit_intermediate<pstore::index::details::internal_node,pstore::exchange::export_ns::diff_out<pstore::exchange::export_ns::emit_fragments(pstore::exchange::export_ns::ostream&,pstore::exchange::export_ns::indent,pstore::database_const&,unsigned_int,pstore::exchange::export_ns::string_mapping_const&,bool)::__0>>
                              (this,(index_pointer)out_local.fn_,shifts,
                               (diff_out<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_exchange_export_fragment_cpp:59:41)>
                                )this_local);
    }
    else {
      node_local.addr_.a_ =
           (address)visit_intermediate<pstore::index::details::linear_node,pstore::exchange::export_ns::diff_out<pstore::exchange::export_ns::emit_fragments(pstore::exchange::export_ns::ostream&,pstore::exchange::export_ns::indent,pstore::database_const&,unsigned_int,pstore::exchange::export_ns::string_mapping_const&,bool)::__0>>
                              (this,(index_pointer)out_local.fn_,shifts,
                               (diff_out<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_exchange_export_fragment_cpp:59:41)>
                                )this_local);
    }
  }
  return (diff_out<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_exchange_export_fragment_cpp:59:41)>
          )node_local.internal_;
}

Assistant:

OutputIterator traverser<Index>::visit_node (index_pointer node, unsigned shifts,
                                                     OutputIterator out) const {
            if (node.is_leaf ()) {
                PSTORE_ASSERT (node.is_address ());
                // If this leaf is not in the "old" byte range then add it to the output
                // collection.
                if (this->is_new (node)) {
                    *out = node.to_address ();
                    ++out;
                }
                return out;
            }

            if (index::details::depth_is_internal_node (shifts)) {
                return this->visit_intermediate<index::details::internal_node> (node, shifts,
                                                                                out);
            }

            return this->visit_intermediate<index::details::linear_node> (node, shifts, out);
        }